

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O0

void QtMWidgets::drawCylinder
               (QPainter *p,QRect *r,QColor *baseColor,bool roundLeftCorner,bool roundRightCorner)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QColor QVar4;
  int local_3dc;
  int local_3c4;
  int local_3a4;
  int local_38c;
  QBrush local_2d8 [8];
  undefined6 local_2d0;
  undefined2 uStack_2ca;
  undefined6 local_2c8;
  undefined2 uStack_2c2;
  undefined6 local_2c0;
  undefined2 local_2ba;
  undefined6 uStack_2b8;
  undefined6 local_2b0;
  undefined2 uStack_2aa;
  undefined6 local_2a8;
  undefined2 uStack_2a2;
  undefined6 local_2a0;
  undefined2 local_29a;
  undefined6 uStack_298;
  undefined6 local_290;
  undefined2 uStack_28a;
  undefined6 local_288;
  undefined2 uStack_282;
  undefined6 local_280;
  undefined2 local_27a;
  undefined6 uStack_278;
  QPointF local_270;
  QPointF local_260;
  undefined1 local_250 [8];
  QLinearGradient backgroundGradient;
  QBrush local_1f8 [8];
  QBrush local_1f0 [8];
  undefined6 local_1e8;
  undefined2 uStack_1e2;
  undefined6 local_1e0;
  undefined2 uStack_1da;
  undefined6 local_1d8;
  undefined2 local_1d2;
  undefined6 uStack_1d0;
  undefined6 local_1c8;
  undefined2 uStack_1c2;
  undefined6 local_1c0;
  undefined2 uStack_1ba;
  undefined6 local_1b8;
  undefined2 local_1b2;
  undefined6 uStack_1b0;
  undefined6 local_1a8;
  undefined2 uStack_1a2;
  undefined6 local_1a0;
  undefined2 uStack_19a;
  undefined6 local_198;
  undefined2 local_192;
  undefined6 uStack_190;
  QPointF local_188;
  QPointF local_178;
  undefined1 local_168 [8];
  QLinearGradient secondVertLineGradient;
  QPointF local_a0;
  QPointF local_90;
  undefined1 local_80 [8];
  QLinearGradient firstVertLineGradient;
  bool roundRightCorner_local;
  bool roundLeftCorner_local;
  QColor *baseColor_local;
  QRect *r_local;
  QPainter *p_local;
  
  QPointF::QPointF(&local_90,0.0,0.0);
  QPointF::QPointF(&local_a0,0.0,1.0);
  QLinearGradient::QLinearGradient((QLinearGradient *)local_80,&local_90,&local_a0);
  QGradient::setCoordinateMode((CoordinateMode)(QLinearGradient *)local_80);
  darkerColor(baseColor,0x32);
  QGradient::setColorAt(0.0,(QColor *)local_80);
  lighterColor(baseColor,0x19);
  QGradient::setColorAt(0.5,(QColor *)local_80);
  darkerColor(baseColor,0x32);
  QGradient::setColorAt(1.0,(QColor *)local_80);
  QPointF::QPointF(&local_178,0.0,0.0);
  QPointF::QPointF(&local_188,0.0,1.0);
  QLinearGradient::QLinearGradient((QLinearGradient *)local_168,&local_178,&local_188);
  QGradient::setCoordinateMode((CoordinateMode)local_168);
  QVar4 = darkerColor(baseColor,0x28);
  local_1a8 = QVar4._0_6_;
  uStack_1a2 = QVar4.ct._2_2_;
  local_1a0 = QVar4.ct._4_6_;
  uStack_19a = QVar4._14_2_;
  uStack_190 = local_1a0;
  local_198 = local_1a8;
  local_192 = uStack_1a2;
  QGradient::setColorAt(0.0,(QColor *)local_168);
  QVar4 = lighterColor(baseColor,0x32);
  local_1c8 = QVar4._0_6_;
  uStack_1c2 = QVar4.ct._2_2_;
  local_1c0 = QVar4.ct._4_6_;
  uStack_1ba = QVar4._14_2_;
  uStack_1b0 = local_1c0;
  local_1b8 = local_1c8;
  local_1b2 = uStack_1c2;
  QGradient::setColorAt(0.5,(QColor *)local_168);
  QVar4 = darkerColor(baseColor,0x28);
  local_1e8 = QVar4._0_6_;
  uStack_1e2 = QVar4.ct._2_2_;
  local_1e0 = QVar4.ct._4_6_;
  uStack_1da = QVar4._14_2_;
  uStack_1d0 = local_1e0;
  local_1d8 = local_1e8;
  local_1d2 = uStack_1e2;
  QGradient::setColorAt(1.0,(QColor *)local_168);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_1f0,(QGradient *)local_80);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_1f0);
  iVar1 = QRect::x(r);
  iVar2 = 0;
  if (roundLeftCorner) {
    iVar2 = 2;
    local_38c = QRect::height(r);
    local_38c = local_38c + -4;
  }
  else {
    local_38c = QRect::height(r);
  }
  QPainter::drawRect(p,iVar1,iVar2,1,local_38c);
  iVar1 = QRect::x(r);
  iVar3 = QRect::width(r);
  iVar2 = 0;
  if (roundRightCorner) {
    iVar2 = 2;
    local_3a4 = QRect::height(r);
    local_3a4 = local_3a4 + -4;
  }
  else {
    local_3a4 = QRect::height(r);
  }
  QPainter::drawRect(p,iVar1 + iVar3 + -1,iVar2,1,local_3a4);
  QBrush::QBrush(local_1f8,(QGradient *)local_168);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_1f8);
  iVar2 = QRect::x(r);
  if (roundLeftCorner) {
    local_3c4 = QRect::height(r);
    local_3c4 = local_3c4 + -2;
  }
  else {
    local_3c4 = QRect::height(r);
  }
  QPainter::drawRect(p,iVar2 + 1,(uint)roundLeftCorner,1,local_3c4);
  iVar2 = QRect::x(r);
  iVar1 = QRect::width(r);
  if (roundRightCorner) {
    local_3dc = QRect::height(r);
    local_3dc = local_3dc + -2;
  }
  else {
    local_3dc = QRect::height(r);
  }
  QPainter::drawRect(p,iVar2 + iVar1 + -2,(uint)roundRightCorner,1,local_3dc);
  iVar2 = QRect::x(r);
  iVar1 = QRect::height(r);
  QPainter::drawRect(p,iVar2 + 2,0,1,iVar1);
  iVar2 = QRect::x(r);
  iVar1 = QRect::width(r);
  iVar3 = QRect::height(r);
  QPainter::drawRect(p,iVar2 + -3 + iVar1,0,1,iVar3);
  QPointF::QPointF(&local_260,0.0,0.0);
  QPointF::QPointF(&local_270,0.0,1.0);
  QLinearGradient::QLinearGradient((QLinearGradient *)local_250,&local_260,&local_270);
  QGradient::setCoordinateMode((CoordinateMode)local_250);
  QGradient::setColorAt(0.0,(QColor *)local_250);
  QVar4 = lighterColor(baseColor,0x4b);
  local_290 = QVar4._0_6_;
  uStack_28a = QVar4.ct._2_2_;
  local_288 = QVar4.ct._4_6_;
  uStack_282 = QVar4._14_2_;
  uStack_278 = local_288;
  local_280 = local_290;
  local_27a = uStack_28a;
  QGradient::setColorAt(0.15,(QColor *)local_250);
  QVar4 = lighterColor(baseColor,200);
  local_2b0 = QVar4._0_6_;
  uStack_2aa = QVar4.ct._2_2_;
  local_2a8 = QVar4.ct._4_6_;
  uStack_2a2 = QVar4._14_2_;
  uStack_298 = local_2a8;
  local_2a0 = local_2b0;
  local_29a = uStack_2aa;
  QGradient::setColorAt(0.5,(QColor *)local_250);
  QVar4 = lighterColor(baseColor,0x4b);
  local_2d0 = QVar4._0_6_;
  uStack_2ca = QVar4.ct._2_2_;
  local_2c8 = QVar4.ct._4_6_;
  uStack_2c2 = QVar4._14_2_;
  uStack_2b8 = local_2c8;
  local_2c0 = local_2d0;
  local_2ba = uStack_2ca;
  QGradient::setColorAt(0.85,(QColor *)local_250);
  QGradient::setColorAt(1.0,(QColor *)local_250);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_2d8,(QGradient *)local_250);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_2d8);
  iVar2 = QRect::x(r);
  iVar1 = QRect::width(r);
  iVar3 = QRect::height(r);
  QPainter::drawRect(p,iVar2 + 3,0,iVar1 + -6,iVar3);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_250);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_168);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_80);
  return;
}

Assistant:

void
drawCylinder( QPainter * p, const QRect & r, const QColor & baseColor,
	bool roundLeftCorner, bool roundRightCorner )
{
	QLinearGradient firstVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	firstVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	firstVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 50 ) );
	firstVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 25 ) );
	firstVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 50 ) );

	QLinearGradient secondVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	secondVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	secondVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 40 ) );
	secondVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 50 ) );
	secondVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 40 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( firstVertLineGradient );

	p->drawRect( r.x(), roundLeftCorner ? 2 : 0,
		1, roundLeftCorner ? r.height() - 4 : r.height() );
	p->drawRect( r.x() + r.width() - 1, roundRightCorner ? 2 : 0,
		1, roundRightCorner ? r.height() - 4 : r.height() );

	p->setBrush( secondVertLineGradient );

	p->drawRect( r.x() + 1, roundLeftCorner ? 1 : 0,
		1, roundLeftCorner ? r.height() - 2 : r.height() );
	p->drawRect( r.x() + r.width() - 2, roundRightCorner ? 1 : 0,
		1, roundRightCorner ? r.height() - 2 : r.height() );

	p->drawRect( r.x() + 2, 0, 1, r.height() );
	p->drawRect( r.x() + r.width() - 3, 0,
		1, r.height() );

	QLinearGradient backgroundGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	backgroundGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	backgroundGradient.setColorAt( 0.0, baseColor );
	backgroundGradient.setColorAt( 0.15, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 0.5, lighterColor( baseColor, 200 ) );
	backgroundGradient.setColorAt( 0.85, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 1.0, baseColor );

	p->setPen( Qt::NoPen );
	p->setBrush( backgroundGradient );
	p->drawRect( r.x() + 3, 0, r.width() - 2 * 3, r.height() );
}